

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

size_t __thiscall Messages::Person::ByteSizeLong(Person *this)

{
  size_type sVar1;
  Rep *pRVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void **ppvVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((~uVar5 & 5) == 0) {
    sVar1 = ((this->name_).ptr_)->_M_string_length;
    uVar6 = (uint)sVar1 | 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    if (this->id_ < 0) {
      uVar10 = 10;
    }
    else {
      uVar6 = this->id_ | 1;
      iVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar10 = (ulong)(iVar4 * 9 + 0x49U >> 6);
    }
    sVar9 = uVar10 + sVar1 + (iVar3 * 9 + 0x49U >> 6) + 2;
  }
  else {
    sVar9 = RequiredFieldsByteSizeFallback(this);
  }
  lVar11 = (long)(this->phones_).super_RepeatedPtrFieldBase.current_size_;
  uVar10 = sVar9 + lVar11;
  pRVar2 = (this->phones_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  if (lVar11 != 0) {
    lVar8 = 0;
    do {
      sVar9 = Person_PhoneNumber::ByteSizeLong(*(Person_PhoneNumber **)((long)ppvVar7 + lVar8));
      uVar5 = (uint)sVar9 | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar10 = uVar10 + sVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar11 * 8 != lVar8);
    uVar5 = (this->_has_bits_).has_bits_[0];
  }
  if ((uVar5 & 2) != 0) {
    sVar1 = ((this->email_).ptr_)->_M_string_length;
    uVar5 = (uint)sVar1 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    uVar10 = uVar10 + sVar1 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  if ((this->field_0x8 & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)uVar10;
    return uVar10;
  }
  sVar9 = google::protobuf::internal::ComputeUnknownFieldsSize
                    ((InternalMetadata *)&this->field_0x8,uVar10,&this->_cached_size_);
  return sVar9;
}

Assistant:

size_t Person::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:Messages.Person)
  size_t total_size = 0;

  if (((_has_bits_[0] & 0x00000005) ^ 0x00000005) == 0) {  // All required fields are present.
    // required string name = 1;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name());

    // required int32 id = 2;
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
        this->_internal_id());

  } else {
    total_size += RequiredFieldsByteSizeFallback();
  }
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .Messages.Person.PhoneNumber phones = 4;
  total_size += 1UL * this->_internal_phones_size();
  for (const auto& msg : this->phones_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // optional string email = 3;
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000002u) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_email());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}